

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ap.c
# Opt level: O0

int create_directory(char *dir)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  int local_14;
  int rc_os;
  int rc;
  char *dir_local;
  
  local_14 = 0;
  if (dir == (char *)0x0) {
    ap_log(AP_LOG_LEVEL_ERROR,"Invalid argument: dir\n");
    local_14 = 3;
  }
  else if (*dir == '\0') {
    ap_log(AP_LOG_LEVEL_ERROR,"Empty path\n");
    local_14 = 3;
  }
  else {
    iVar1 = mkdir(dir,0x1c0);
    if ((iVar1 != 0) && (piVar2 = __errno_location(), *piVar2 != 0x11)) {
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      ap_log(AP_LOG_LEVEL_ERROR,"Can not create directory \'%s\', error: \'%s\'\n",dir,pcVar3);
      local_14 = 6;
    }
  }
  return local_14;
}

Assistant:

static int create_directory (const char *dir)
{
	int			rc				= AP_NO_ERROR;
	int			rc_os;

	AP_VALIDATE_PTR_ARGUMENT (dir);

	if (*dir == '\0')
	{
		ap_error ("Empty path\n");
		rc = AP_ERROR_INVALID_ARGUMENT;

		goto finish;
	}

#	if defined (_WIN32)
	rc_os = _mkdir (dir);
#	else
	rc_os = mkdir (dir, 0700);
#	endif
	if (rc_os != 0)
	{
		if (errno != EEXIST)
		{
			ap_error ("Can not create directory '%s', error: '%s'\n", dir, strerror (errno));
			rc = AP_ERROR_ENVIRONMENT;

			goto finish;
		}
	}

finish:
	return rc;
}